

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btGeneric6DofConstraint.cpp
# Opt level: O2

void __thiscall
btGeneric6DofConstraint::buildLinearJacobian
          (btGeneric6DofConstraint *this,btJacobianEntry *jacLinear,btVector3 *normalWorld,
          btVector3 *pivotAInW,btVector3 *pivotBInW)

{
  btRigidBody *pbVar1;
  btRigidBody *pbVar2;
  btVector3 local_b0;
  btVector3 local_a0;
  btMatrix3x3 local_90;
  btMatrix3x3 local_60;
  
  btMatrix3x3::transpose
            (&local_90,
             &(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).m_worldTransform.
              m_basis);
  btMatrix3x3::transpose
            (&local_60,
             &(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).m_worldTransform.
              m_basis);
  local_a0 = operator-(pivotAInW,
                       &(((this->super_btTypedConstraint).m_rbA)->super_btCollisionObject).
                        m_worldTransform.m_origin);
  local_b0 = operator-(pivotBInW,
                       &(((this->super_btTypedConstraint).m_rbB)->super_btCollisionObject).
                        m_worldTransform.m_origin);
  pbVar1 = (this->super_btTypedConstraint).m_rbA;
  pbVar2 = (this->super_btTypedConstraint).m_rbB;
  btJacobianEntry::btJacobianEntry
            (jacLinear,&local_90,&local_60,&local_a0,&local_b0,normalWorld,
             &pbVar1->m_invInertiaLocal,pbVar1->m_inverseMass,&pbVar2->m_invInertiaLocal,
             pbVar2->m_inverseMass);
  return;
}

Assistant:

void btGeneric6DofConstraint::buildLinearJacobian(
	btJacobianEntry & jacLinear,const btVector3 & normalWorld,
	const btVector3 & pivotAInW,const btVector3 & pivotBInW)
{
	new (&jacLinear) btJacobianEntry(
        m_rbA.getCenterOfMassTransform().getBasis().transpose(),
        m_rbB.getCenterOfMassTransform().getBasis().transpose(),
        pivotAInW - m_rbA.getCenterOfMassPosition(),
        pivotBInW - m_rbB.getCenterOfMassPosition(),
        normalWorld,
        m_rbA.getInvInertiaDiagLocal(),
        m_rbA.getInvMass(),
        m_rbB.getInvInertiaDiagLocal(),
        m_rbB.getInvMass());
}